

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.h
# Opt level: O2

void __thiscall
llvm::cl::Option::Option(Option *this,NumOccurrencesFlag OccurrencesFlag,OptionHidden Hidden)

{
  void **ppvVar1;
  
  this->_vptr_Option = (_func_int **)&PTR___cxa_pure_virtual_001c8520;
  this->NumOccurrences = 0;
  *(ushort *)&this->field_0xc =
       (ushort)((Hidden & (ReallyHidden|Hidden)) << 5) | (ushort)OccurrencesFlag & 7 |
       (ushort)*(undefined4 *)&this->field_0xc & 0xf000;
  this->Position = 0;
  this->AdditionalVals = 0;
  (this->ArgStr).Data = (char *)0x0;
  (this->ValueStr).Length = 0;
  (this->ArgStr).Length = 0;
  (this->HelpStr).Data = (char *)0x0;
  (this->HelpStr).Length = 0;
  (this->ValueStr).Data = (char *)0x0;
  this->Category = (OptionCategory *)&GeneralCategory;
  ppvVar1 = (this->Subs).SmallStorage;
  (this->Subs).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.super_SmallPtrSetImplBase.SmallArray =
       ppvVar1;
  (this->Subs).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.super_SmallPtrSetImplBase.CurArray =
       ppvVar1;
  (this->Subs).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.super_SmallPtrSetImplBase.CurArraySize
       = 4;
  (this->Subs).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.super_SmallPtrSetImplBase.NumNonEmpty =
       0;
  (this->Subs).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.super_SmallPtrSetImplBase.NumTombstones
       = 0;
  this->FullyInitialized = false;
  return;
}

Assistant:

explicit Option(enum NumOccurrencesFlag OccurrencesFlag,
                  enum OptionHidden Hidden)
      : Occurrences(OccurrencesFlag), Value(0), HiddenFlag(Hidden),
        Formatting(NormalFormatting), Misc(0), Category(&GeneralCategory) {}